

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

IO __thiscall adios2::ADIOS::AtIO(ADIOS *this,string *name)

{
  element_type *peVar1;
  IO *io;
  string *in_RSI;
  char *in_stack_ffffffffffffff50;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_88 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa8;
  ADIOS *in_stack_ffffffffffffffb0;
  string local_38 [48];
  IO local_8;
  
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  CheckPointer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  peVar1 = std::__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x285e72);
  this_00 = local_88;
  std::__cxx11::string::string(this_00,in_RSI);
  io = (IO *)adios2::core::ADIOS::AtIO(peVar1,this_00);
  IO::IO(&local_8,io);
  std::__cxx11::string::~string(local_88);
  return (IO)local_8.m_IO;
}

Assistant:

IO ADIOS::AtIO(const std::string name)
{
    CheckPointer("for io name " + name + ", in call to ADIOS::AtIO");
    return IO(&m_ADIOS->AtIO(name));
}